

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QArgumentType>::reallocate_impl
          (QVLABase<QArgumentType> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  void *__src;
  long lVar1;
  long lVar2;
  size_t sVar3;
  void *__dest;
  ulong __size;
  size_t totalCapacity;
  qsizetype qVar4;
  
  __src = (this->super_QVLABaseBase).ptr;
  lVar1 = (this->super_QVLABaseBase).a;
  lVar2 = (this->super_QVLABaseBase).s;
  qVar4 = asize;
  if (lVar2 < asize) {
    qVar4 = lVar2;
  }
  __dest = __src;
  if (lVar1 != aalloc) {
    __dest = array;
    if (prealloc < aalloc) {
      if ((ulong)aalloc >> 0x3b != 0) {
LAB_00285358:
        qBadAlloc();
      }
      sVar3 = QtPrivate::expectedAllocSize(aalloc << 5,0x10);
      __size = sVar3 & 0xffffffffffffffe0;
      if (sVar3 == 0) {
        __size = aalloc << 5;
      }
      if (__size == 0) goto LAB_00285358;
      prealloc = sVar3 >> 5;
      if (sVar3 == 0) {
        prealloc = aalloc;
      }
      __dest = malloc(__size);
      if (__dest == (void *)0x0) goto LAB_00285358;
    }
    if (qVar4 != 0) {
      memcpy(__dest,__src,qVar4 << 5);
    }
    (this->super_QVLABaseBase).ptr = __dest;
    (this->super_QVLABaseBase).a = prealloc;
  }
  (this->super_QVLABaseBase).s = qVar4;
  if (asize < lVar2) {
    std::_Destroy_aux<false>::__destroy<QArgumentType*>
              ((QArgumentType *)(asize * 0x20 + (long)__src),
               (QArgumentType *)(lVar2 * 0x20 + (long)__src));
    __dest = (this->super_QVLABaseBase).ptr;
  }
  if ((__src != array) && (__src != __dest)) {
    QtPrivate::sizedFree(__src,lVar1 << 5);
    return;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}